

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O2

void protozero::add_varint_to_buffer<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *buffer,
               uint64_t value)

{
  for (; 0x7f < value; value = value >> 7) {
    std::__cxx11::string::push_back((char)buffer);
  }
  std::__cxx11::string::push_back((char)buffer);
  return;
}

Assistant:

inline void add_varint_to_buffer(TBuffer* buffer, uint64_t value) {
    while (value >= 0x80U) {
        buffer_customization<TBuffer>::push_back(buffer, static_cast<char>((value & 0x7fU) | 0x80U));
        value >>= 7U;
    }
    buffer_customization<TBuffer>::push_back(buffer, static_cast<char>(value));
}